

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ripemd160.cpp
# Opt level: O0

CRIPEMD160 * __thiscall CRIPEMD160::Write(CRIPEMD160 *this,uchar *data,size_t len)

{
  long lVar1;
  void *pvVar2;
  long in_RDX;
  void *in_RSI;
  CRIPEMD160 *in_RDI;
  long in_FS_OFFSET;
  size_t bufsize;
  uchar *end;
  uchar *in_stack_00000068;
  uint32_t *in_stack_00000070;
  ulong local_30;
  void *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = (void *)((long)in_RSI + in_RDX);
  local_30 = in_RDI->bytes & 0x3f;
  local_18 = in_RSI;
  if ((local_30 != 0) && (0x3f < local_30 + in_RDX)) {
    memcpy(in_RDI->buf + local_30,in_RSI,0x40 - local_30);
    in_RDI->bytes = (0x40 - local_30) + in_RDI->bytes;
    local_18 = (void *)((0x40 - local_30) + (long)in_RSI);
    anon_unknown.dwarf_4c7eca::ripemd160::Transform(in_stack_00000070,in_stack_00000068);
    local_30 = 0;
  }
  for (; 0x3f < (long)pvVar2 - (long)local_18; local_18 = (void *)((long)local_18 + 0x40)) {
    anon_unknown.dwarf_4c7eca::ripemd160::Transform(in_stack_00000070,in_stack_00000068);
    in_RDI->bytes = in_RDI->bytes + 0x40;
  }
  if (local_18 < pvVar2) {
    memcpy(in_RDI->buf + local_30,local_18,(long)pvVar2 - (long)local_18);
    in_RDI->bytes = (long)pvVar2 + (in_RDI->bytes - (long)local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

CRIPEMD160& CRIPEMD160::Write(const unsigned char* data, size_t len)
{
    const unsigned char* end = data + len;
    size_t bufsize = bytes % 64;
    if (bufsize && bufsize + len >= 64) {
        // Fill the buffer, and process it.
        memcpy(buf + bufsize, data, 64 - bufsize);
        bytes += 64 - bufsize;
        data += 64 - bufsize;
        ripemd160::Transform(s, buf);
        bufsize = 0;
    }
    while (end - data >= 64) {
        // Process full chunks directly from the source.
        ripemd160::Transform(s, data);
        bytes += 64;
        data += 64;
    }
    if (end > data) {
        // Fill the buffer with what remains.
        memcpy(buf + bufsize, data, end - data);
        bytes += end - data;
    }
    return *this;
}